

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcAnalyzer::HdlcBytesToVectorBytes
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *asyncBytes)

{
  pointer *ppuVar1;
  long lVar2;
  uchar uVar3;
  pointer pHVar4;
  ulong uVar5;
  ulong uVar6;
  iterator __position;
  bool bVar7;
  U8 local_29;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHVar4 = (asyncBytes->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((asyncBytes->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
      super__Vector_impl_data._M_finish != pHVar4) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      if (pHVar4[uVar5].escaped == true) {
        uVar3 = HdlcAnalyzerSettings::Bit5Inv(pHVar4[uVar5].value);
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_29 = uVar3;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
          _M_realloc_insert<unsigned_char>(__return_storage_ptr__,__position,&local_29);
        }
        else {
LAB_00109cc9:
          *__position._M_current = uVar3;
          ppuVar1 = &(__return_storage_ptr__->
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
      }
      else {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current !=
            (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          uVar3 = pHVar4[uVar5].value;
          goto LAB_00109cc9;
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                   __position,&pHVar4[uVar5].value);
      }
      pHVar4 = (asyncBytes->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = ((long)(asyncBytes->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pHVar4 >> 3) * -0x5555555555555555;
      bVar7 = uVar6 <= uVar5;
      lVar2 = uVar5 - uVar6;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar7 && lVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcAnalyzer::HdlcBytesToVectorBytes( const vector<HdlcByte>& asyncBytes ) const
{
    vector<U8> ret;
    for( U32 i = 0; i < asyncBytes.size(); ++i )
    {
        if( asyncBytes[ i ].escaped )
            ret.push_back( HdlcAnalyzerSettings::Bit5Inv( asyncBytes[ i ].value ) );
        else
            ret.push_back( asyncBytes[ i ].value );
    }
    return ret;
}